

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_ManExploreNewCut
              (Mpm_Man_t *p,Mig_Obj_t *pObj,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2,
              int Required)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Mpm_Cut_t *pMStack_48;
  int ArrTime;
  Mpm_Cut_t *pCut;
  int Required_local;
  Mpm_Cut_t *pCut2_local;
  Mpm_Cut_t *pCut1_local;
  Mpm_Cut_t *pCut0_local;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *p_local;
  
  if (*(uint *)&pCut0->field_0x4 >> 0x1b < *(uint *)&pCut1->field_0x4 >> 0x1b) {
    pMStack_48 = Mpm_ManMergeCuts(p,pCut1,pCut0,pCut2);
    if (pMStack_48 == (Mpm_Cut_t *)0x0) {
      return 1;
    }
    if (p->pPars->fUseTruth != 0) {
      iVar1 = Mig_ObjFaninC1(pObj);
      iVar2 = Mig_ObjFaninC0(pObj);
      uVar5 = Mig_ObjFaninC2(pObj);
      iVar3 = Mig_ObjNodeType(pObj);
      Mpm_CutComputeTruth(p,pMStack_48,pCut1,pCut0,pCut2,iVar1,iVar2,uVar5 ^ 1,iVar3);
      goto LAB_005610dd;
    }
    if (p->pPars->fUseDsd == 0) goto LAB_005610dd;
    iVar1 = Mig_ObjFaninC1(pObj);
    iVar2 = Mig_ObjFaninC0(pObj);
    uVar5 = Mig_ObjFaninC2(pObj);
    iVar3 = Mig_ObjNodeType(pObj);
    iVar1 = Mpm_CutComputeDsd6(p,pMStack_48,pCut1,pCut0,pCut2,iVar1,iVar2,uVar5 ^ 1,iVar3);
  }
  else {
    pMStack_48 = Mpm_ManMergeCuts(p,pCut0,pCut1,pCut2);
    if (pMStack_48 == (Mpm_Cut_t *)0x0) {
      return 1;
    }
    if (p->pPars->fUseTruth != 0) {
      iVar1 = Mig_ObjFaninC0(pObj);
      iVar2 = Mig_ObjFaninC1(pObj);
      iVar3 = Mig_ObjFaninC2(pObj);
      iVar4 = Mig_ObjNodeType(pObj);
      Mpm_CutComputeTruth(p,pMStack_48,pCut0,pCut1,pCut2,iVar1,iVar2,iVar3,iVar4);
      goto LAB_005610dd;
    }
    if (p->pPars->fUseDsd == 0) goto LAB_005610dd;
    iVar1 = Mig_ObjFaninC0(pObj);
    iVar2 = Mig_ObjFaninC1(pObj);
    iVar3 = Mig_ObjFaninC2(pObj);
    iVar4 = Mig_ObjNodeType(pObj);
    iVar1 = Mpm_CutComputeDsd6(p,pMStack_48,pCut0,pCut1,pCut2,iVar1,iVar2,iVar3,iVar4);
  }
  if (iVar1 == 0) {
    return 1;
  }
LAB_005610dd:
  iVar1 = Mpm_CutGetArrTime(p,pMStack_48);
  if ((p->fMainRun == 0) || (iVar1 <= Required)) {
    Mpm_ObjAddCutToStore(p,pMStack_48,iVar1);
  }
  return 1;
}

Assistant:

static inline int Mpm_ManExploreNewCut( Mpm_Man_t * p, Mig_Obj_t * pObj, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2, int Required )
{
    Mpm_Cut_t * pCut;
    int ArrTime;
#ifdef MIG_RUNTIME
abctime clk = clock();
#endif

    if ( pCut0->nLeaves >= pCut1->nLeaves )
    {
        pCut = Mpm_ManMergeCuts( p, pCut0, pCut1, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }
    else
    {
        pCut = Mpm_ManMergeCuts( p, pCut1, pCut0, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }

#ifdef MIG_RUNTIME
clk = clock();
#endif
    ArrTime = Mpm_CutGetArrTime( p, pCut );
#ifdef MIG_RUNTIME
p->timeEval += clock() - clk;
#endif
    if ( p->fMainRun && ArrTime > Required )
        return 1;

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjAddCutToStore( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeStore += Abc_Clock() - clk;
#endif

/*
    // return 0 if const or buffer cut is derived - reset all cuts to contain only one --- does not work
//    if ( pCut->nLeaves < 2 && p->nCutStore == 1 )
//        return 0;
    if ( pCut->nLeaves < 2 ) 
    {
        int i;
        assert( p->nCutStore >= 1 );
        for ( i = 1; i < p->nCutStore; i++ )
            Vec_PtrPush( &p->vFreeUnits, p->pCutStore[i] );
        p->nCutStore = 1;
        return 0;
    }
*/
    return 1;
}